

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

RunningSection * __thiscall
Catch::RunningSection::findOrAddSubSection(RunningSection *this,string *name,bool *changed)

{
  pointer *pppRVar1;
  pointer pcVar2;
  iterator __position;
  int iVar3;
  RunningSection *in_RAX;
  RunningSection *extraout_RAX;
  undefined4 extraout_var;
  RunningSection *extraout_RAX_00;
  RunningSection *pRVar4;
  pointer ppRVar5;
  bool bVar6;
  bool bVar7;
  RunningSection *subSection;
  RunningSection *local_58;
  size_t local_50;
  _Alloc_hider local_38;
  
  ppRVar5 = (this->m_subSections).
            super__Vector_base<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  bVar6 = ppRVar5 ==
          (this->m_subSections).
          super__Vector_base<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>.
          _M_impl.super__Vector_impl_data._M_finish;
  local_38._M_p = changed;
  if (!bVar6) {
    do {
      pcVar2 = ((*ppRVar5)->m_name)._M_dataplus._M_p;
      local_58 = (RunningSection *)&stack0xffffffffffffffb8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,pcVar2,pcVar2 + ((*ppRVar5)->m_name)._M_string_length);
      in_RAX = extraout_RAX;
      if (local_50 == name->_M_string_length) {
        if (local_50 == 0) {
          bVar7 = true;
        }
        else {
          iVar3 = bcmp(local_58,(name->_M_dataplus)._M_p,local_50);
          in_RAX = (RunningSection *)CONCAT44(extraout_var,iVar3);
          bVar7 = iVar3 == 0;
        }
      }
      else {
        bVar7 = false;
      }
      if (local_58 != (RunningSection *)&stack0xffffffffffffffb8) {
        operator_delete(local_58);
        in_RAX = extraout_RAX_00;
      }
      if (bVar7) {
        in_RAX = *ppRVar5;
        break;
      }
      ppRVar5 = ppRVar5 + 1;
      bVar6 = ppRVar5 ==
              (this->m_subSections).
              super__Vector_base<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    } while (!bVar6);
  }
  if (bVar6) {
    pRVar4 = (RunningSection *)operator_new(0x48);
    pRVar4->m_state = Unknown;
    pRVar4->m_parent = this;
    (pRVar4->m_name)._M_dataplus._M_p = (pointer)&(pRVar4->m_name).field_2;
    pcVar2 = (name->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pRVar4->m_name,pcVar2,pcVar2 + name->_M_string_length);
    (pRVar4->m_subSections).
    super__Vector_base<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar4->m_subSections).
    super__Vector_base<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pRVar4->m_subSections).
    super__Vector_base<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __position._M_current =
         (this->m_subSections).
         super__Vector_base<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_58 = pRVar4;
    if (__position._M_current ==
        (this->m_subSections).
        super__Vector_base<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<Catch::RunningSection*,std::allocator<Catch::RunningSection*>>::
      _M_realloc_insert<Catch::RunningSection*const&>
                ((vector<Catch::RunningSection*,std::allocator<Catch::RunningSection*>> *)
                 &this->m_subSections,__position,&local_58);
    }
    else {
      *__position._M_current = pRVar4;
      pppRVar1 = &(this->m_subSections).
                  super__Vector_base<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppRVar1 = *pppRVar1 + 1;
    }
    this->m_state = Branch;
    *local_38._M_p = true;
    in_RAX = local_58;
  }
  return in_RAX;
}

Assistant:

RunningSection* findOrAddSubSection( std::string const& name, bool& changed ) {
            for(    SubSections::const_iterator it = m_subSections.begin();
                    it != m_subSections.end();
                    ++it)
                if( (*it)->getName() == name )
                    return *it;
            RunningSection* subSection = new RunningSection( this, name );
            m_subSections.push_back( subSection );
            m_state = Branch;
            changed = true;
            return subSection;
        }